

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-desc.c
# Opt level: O3

size_t obj_desc_chest(object *obj,char *buf,size_t max,size_t end)

{
  _Bool _Var1;
  char *pcVar2;
  size_t local_28;
  
  local_28 = end;
  _Var1 = tval_is_chest(obj);
  if ((_Var1) && ((obj->pval == 0 || (obj->known->pval != 0)))) {
    pcVar2 = chest_trap_name(obj);
    strnfcat(buf,max,&local_28," (%s)",pcVar2);
    end = local_28;
  }
  return end;
}

Assistant:

static size_t obj_desc_chest(const struct object *obj, char *buf, size_t max,
							 size_t end)
{
	if (!tval_is_chest(obj)) return end;

	/* The chest is unopened, but we know nothing about its trap/lock */
	if (obj->pval && !obj->known->pval) return end;

	/* Describe the traps */
	strnfcat(buf, max, &end, " (%s)", chest_trap_name(obj));

	return end;
}